

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ber.cc
# Opt level: O2

int cbs_find_ber(CBS *orig_in,int *ber_found,uint32_t depth)

{
  int iVar1;
  int iVar2;
  CBS_ASN1_TAG tag;
  size_t header_len;
  int indefinite;
  CBS in;
  CBS contents;
  
  iVar2 = 0;
  if (depth < 0x81) {
    in.data = orig_in->data;
    in.len = orig_in->len;
    *ber_found = 0;
    iVar2 = 1;
    while( true ) {
      do {
        if (in.len == 0) {
          return 1;
        }
        iVar1 = CBS_get_any_ber_asn1_element(&in,&contents,&tag,&header_len,ber_found,&indefinite);
        if (iVar1 == 0) {
          return 0;
        }
        if (*ber_found != 0) {
          return 1;
        }
      } while ((tag >> 0x1d & 1) == 0);
      if (((tag & 0xdfffffff) < 0x1f) && ((0x5e7c1010U >> (tag & 0x1f) & 1) != 0)) break;
      iVar1 = CBS_skip(&contents,header_len);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = cbs_find_ber(&contents,ber_found,depth + 1);
      if (iVar1 == 0) {
        return 0;
      }
      if (*ber_found != 0) {
        return 1;
      }
    }
    *ber_found = 1;
  }
  return iVar2;
}

Assistant:

static int cbs_find_ber(const CBS *orig_in, int *ber_found, uint32_t depth) {
  if (depth > kMaxDepth) {
    return 0;
  }

  CBS in = *orig_in;
  *ber_found = 0;

  while (CBS_len(&in) > 0) {
    CBS contents;
    CBS_ASN1_TAG tag;
    size_t header_len;
    int indefinite;
    if (!CBS_get_any_ber_asn1_element(&in, &contents, &tag, &header_len,
                                      ber_found, &indefinite)) {
      return 0;
    }
    if (*ber_found) {
      return 1;
    }
    if (tag & CBS_ASN1_CONSTRUCTED) {
      if (is_string_type(tag)) {
        // Constructed strings are only legal in BER and require conversion.
        *ber_found = 1;
        return 1;
      }
      if (!CBS_skip(&contents, header_len) ||
          !cbs_find_ber(&contents, ber_found, depth + 1)) {
        return 0;
      }
      if (*ber_found) {
        // We already found BER. No need to continue parsing.
        return 1;
      }
    }
  }

  return 1;
}